

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O3

void Color::print_row<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *column,vector<int,_std::allocator<int>_> *width)

{
  pointer pbVar1;
  pointer pbVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  Logger local_6c;
  string local_68;
  string local_48;
  
  pbVar1 = (column->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (column->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)pbVar1 - (long)pbVar2 >> 5 ==
      (long)(width->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(width->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start >> 2) {
    if (pbVar1 != pbVar2) {
      lVar4 = 8;
      uVar5 = 0;
      do {
        *(long *)(operator_delete__ + *(long *)(std::cout + -0x18)) =
             (long)(width->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,*(char **)((long)pbVar2 + lVar4 + -8),
                   *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar4));
        pbVar2 = (column->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x20;
      } while (uVar5 < (ulong)((long)(column->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5
                              ));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    return;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_6c.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/format_print.h"
             ,"");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"print_row","");
  poVar3 = Logger::Start(ERR,&local_48,0xd4,&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK_EQ failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/format_print.h"
             ,0x5a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0xd4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"column.size()",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"width.size()",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

void print_row(const std::vector<T> &column, const std::vector<int> &width) {
  CHECK_EQ(column.size(), width.size());
  for (size_t i = 0; i < column.size(); ++i) {
    std::cout.width(width[i]);
    std::cout << column[i];
  }
  std::cout << "\n";
}